

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlineScriptFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,StackSym *symCallerThis,
          ProfileId profileId,bool *pIsInlined,Instr *inlineeDefInstr,uint recursiveInlineDepth)

{
  TSize TVar1;
  Func *pFVar2;
  code *pcVar3;
  Func *runtimeInfo_00;
  FunctionJITRuntimeInfo *polymorphicInlineCacheInfo;
  bool bVar4;
  ExecutionMode EVar5;
  ArgSlot AVar6;
  uint sourceContextId;
  uint functionId;
  uint32 postCallByteCodeOffset;
  ScriptContext *pSVar7;
  ThreadContext *this_00;
  Opnd *pOVar8;
  SymOpnd *pSVar9;
  StackSym *pSVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  JITTimeFunctionBody *this_01;
  char16 *pcVar13;
  undefined4 *puVar14;
  ProfiledInstr *pPVar15;
  JitArenaAllocator *pJVar16;
  JITTimeWorkItem *pJVar17;
  CodeGenWorkItemIDL *pCVar18;
  intptr_t iVar19;
  FunctionJITTimeInfo *pFVar20;
  Func *this_02;
  ThreadContextInfo *threadContextInfo;
  ScriptContextInfo *scriptContextInfo;
  JITOutput *this_03;
  JITOutputIDL *outputData;
  void *codeGenAllocators;
  ScriptContextProfiler *codeGenProfiler;
  Instr *this_04;
  Func *local_2c8;
  TrackAllocData local_228;
  Func *local_200;
  Func *inlinee;
  FunctionJITRuntimeInfo *runtimeInfo;
  JITTimePolymorphicInlineCacheInfo *entryPointPolymorphicInlineCacheInfo;
  undefined8 local_1e0;
  TrackAllocData local_1d8;
  JITTimeWorkItem *local_1b0;
  JITTimeWorkItem *jitWorkItem;
  undefined8 local_1a0;
  TrackAllocData local_198;
  CodeGenWorkItemIDL *local_170;
  CodeGenWorkItemIDL *workItemData;
  RegOpnd *pRStack_160;
  RegSlot returnRegSlot;
  RegOpnd *returnValueOpnd;
  ProfileId callSiteId;
  Instr *pIStack_150;
  bool split;
  Instr *inlineBailoutChecksBeforeInstr;
  bool safeThis;
  bool isCtor;
  bool isFixed;
  StackSym *pSStack_140;
  bool originalCallTargetOpndIsJITOpt;
  StackSym *originalCallTargetStackSym;
  char16 debugStringBuffer2 [42];
  wchar local_d8 [4];
  char16 debugStringBuffer [42];
  JITTimeFunctionBody *funcBody;
  Func *funcCaller;
  Instr *instrNext;
  bool *pIsInlined_local;
  ProfileId profileId_local;
  StackSym *symCallerThis_local;
  FunctionJITTimeInfo *inlineeData_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  *pIsInlined = false;
  bVar4 = Func::IsBackgroundJIT(this->topFunc);
  if (!bVar4) {
    pSVar7 = Func::GetScriptContext(this->topFunc);
    this_00 = Js::ScriptContext::GetThreadContext(pSVar7);
    pSVar7 = Func::GetScriptContext(this->topFunc);
    ThreadContext::ProbeStackNoDispose(this_00,0xc00,pSVar7,(PVOID)0x0);
  }
  this_local = (Inline *)callInstr->m_next;
  pFVar2 = callInstr->m_func;
  register0x00000000 = FunctionJITTimeInfo::GetBody(inlineeData);
  bVar4 = Func::IsLoopBody(callInstr->m_func);
  if ((!bVar4) ||
     (bVar4 = JITTimeFunctionBody::UsesArgumentsObject(stack0xffffffffffffff80), !bVar4)) {
    pOVar8 = IR::Instr::GetSrc2(callInstr);
    if (pOVar8 != (Opnd *)0x0) {
      pOVar8 = IR::Instr::GetSrc2(callInstr);
      bVar4 = IR::Opnd::IsSymOpnd(pOVar8);
      if (bVar4) {
        pOVar8 = IR::Instr::GetSrc2(callInstr);
        pSVar9 = IR::Opnd::AsSymOpnd(pOVar8);
        pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
        AVar6 = StackSym::GetArgSlotNum(pSVar10);
        if (0xf < AVar6) {
          sourceContextId = Func::GetSourceContextId(this->topFunc);
          functionId = Func::GetLocalFunctionId(this->topFunc);
          bVar4 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01ec73f0,InlinePhase,sourceContextId,functionId);
          if (!bVar4) {
            return (Instr *)this_local;
          }
          pcVar11 = JITTimeFunctionBody::GetDisplayName(stack0xffffffffffffff80);
          pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeData,(wchar (*) [42])local_d8);
          pOVar8 = IR::Instr::GetSrc2(callInstr);
          pSVar9 = IR::Opnd::AsSymOpnd(pOVar8);
          pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
          AVar6 = StackSym::GetArgSlotNum(pSVar10);
          this_01 = Func::GetJITFunctionBody(pFVar2);
          pcVar13 = JITTimeFunctionBody::GetDisplayName(this_01);
          Func::GetDebugNumberSet(pFVar2,(wchar (*) [42])&originalCallTargetStackSym);
          Output::Print(L"INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                        ,pcVar11,pcVar12,(ulong)AVar6,0xf,pcVar13);
          Output::Flush();
          return (Instr *)this_local;
        }
      }
    }
    *pIsInlined = true;
    pOVar8 = IR::Instr::GetSrc1(callInstr);
    pSStack_140 = IR::Opnd::GetStackSym(pOVar8);
    pOVar8 = IR::Instr::GetSrc1(callInstr);
    inlineBailoutChecksBeforeInstr._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar8);
    inlineBailoutChecksBeforeInstr._6_1_ = 0;
    inlineBailoutChecksBeforeInstr._5_1_ = 0;
    inlineBailoutChecksBeforeInstr._4_1_ = 0;
    if ((callInstr->m_opcode == NewScObject) || (callInstr->m_opcode == NewScObjArray)) {
      inlineBailoutChecksBeforeInstr._5_1_ = 1;
      inlineBailoutChecksBeforeInstr._6_1_ =
           TryOptimizeCallInstrWithFixedMethod
                     (this,callInstr,inlineeData,false,false,true,true,
                      (bool *)((long)&inlineBailoutChecksBeforeInstr + 4),false,0);
      returnValueOpnd._7_1_ =
           SplitConstructorCall
                     (this,callInstr,true,(bool)inlineBailoutChecksBeforeInstr._6_1_,
                      &stack0xfffffffffffffeb0,(Instr **)0x0);
      if ((!(bool)returnValueOpnd._7_1_) || (pIStack_150 == (Instr *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x10ac,"(split && inlineBailoutChecksBeforeInstr != nullptr)",
                           "split && inlineBailoutChecksBeforeInstr != nullptr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 0;
      }
    }
    else {
      inlineBailoutChecksBeforeInstr._6_1_ =
           TryOptimizeCallInstrWithFixedMethod
                     (this,callInstr,inlineeData,false,false,false,true,
                      (bool *)((long)&inlineBailoutChecksBeforeInstr + 4),false,0);
      pIStack_150 = callInstr;
    }
    bVar4 = IR::Instr::IsProfiledInstr(callInstr);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x10b5,"(callInstr->IsProfiledInstr())","callInstr->IsProfiledInstr()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar14 = 0;
    }
    pPVar15 = IR::Instr::AsProfiledInstr(callInstr);
    returnValueOpnd._4_2_ = (pPVar15->u).field_3.fldInfoData.f1;
    pOVar8 = IR::Instr::GetDst(callInstr);
    if (pOVar8 == (Opnd *)0x0) {
      pRStack_160 = (RegOpnd *)0x0;
      workItemData._4_4_ = 0xffffffff;
    }
    else {
      pOVar8 = IR::Instr::UnlinkDst(callInstr);
      pRStack_160 = IR::Opnd::AsRegOpnd(pOVar8);
      workItemData._4_4_ = StackSym::GetByteCodeRegSlot(pRStack_160->m_sym);
    }
    pJVar16 = this->topFunc->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_198,(type_info *)&CodeGenWorkItemIDL::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
               ,0x10c5);
    pJVar16 = (JitArenaAllocator *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar16,&local_198);
    jitWorkItem = (JITTimeWorkItem *)Memory::JitArenaAllocator::Alloc;
    local_1a0 = 0;
    local_170 = (CodeGenWorkItemIDL *)new<Memory::JitArenaAllocator>(0x60,pJVar16,0x4e98c0);
    bVar4 = Func::IsJitInDebugMode(this->topFunc);
    local_170->isJitInDebugMode = bVar4;
    local_170->type = '\0';
    pJVar17 = Func::GetWorkItem(this->topFunc);
    EVar5 = JITTimeWorkItem::GetJitMode(pJVar17);
    local_170->jitMode = EVar5;
    pJVar17 = Func::GetWorkItem(this->topFunc);
    pCVar18 = JITTimeWorkItem::GetWorkItemData(pJVar17);
    local_170->nativeDataAddr = pCVar18->nativeDataAddr;
    local_170->loopNumber = 0xffffffff;
    local_170->jitData = &inlineeData->m_data;
    pJVar16 = this->topFunc->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_1d8,(type_info *)&JITTimeWorkItem::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
               ,0x10ce);
    pJVar16 = (JitArenaAllocator *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar16,&local_1d8);
    entryPointPolymorphicInlineCacheInfo =
         (JITTimePolymorphicInlineCacheInfo *)Memory::JitArenaAllocator::Alloc;
    local_1e0 = 0;
    pJVar17 = (JITTimeWorkItem *)new<Memory::JitArenaAllocator>(0x1e0,pJVar16,0x4e98c0);
    JITTimeWorkItem::JITTimeWorkItem(pJVar17,local_170);
    local_1b0 = pJVar17;
    pJVar17 = Func::GetWorkItem(this->topFunc);
    iVar19 = JITTimeFunctionBody::GetAddr(stack0xffffffffffffff80);
    runtimeInfo = (FunctionJITRuntimeInfo *)
                  JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(pJVar17,iVar19);
    if (inlineeDefInstr == (Instr *)0x0) {
      pJVar17 = Func::GetWorkItem(pFVar2);
      pFVar20 = JITTimeWorkItem::GetJITTimeInfo(pJVar17);
      iVar19 = JITTimeFunctionBody::GetAddr(stack0xffffffffffffff80);
      local_2c8 = (Func *)FunctionJITTimeInfo::GetInlineeForTargetInlineeRuntimeData
                                    (pFVar20,profileId,iVar19);
    }
    else {
      pJVar17 = Func::GetWorkItem(inlineeDefInstr->m_func);
      pFVar20 = JITTimeWorkItem::GetJITTimeInfo(pJVar17);
      pPVar15 = IR::Instr::AsProfiledInstr(inlineeDefInstr);
      TVar1 = (pPVar15->u).field_3.fldInfoData;
      iVar19 = JITTimeFunctionBody::GetAddr(stack0xffffffffffffff80);
      local_2c8 = (Func *)FunctionJITTimeInfo::GetInlineeForCallbackInlineeRuntimeData
                                    (pFVar20,TVar1.f1,iVar19);
    }
    inlinee = local_2c8;
    pJVar16 = this->topFunc->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_228,(type_info *)&Func::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
               ,0x10fe);
    pJVar16 = (JitArenaAllocator *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar16,&local_228);
    this_02 = (Func *)new<Memory::JitArenaAllocator>(0x420,pJVar16,0x4e98c0);
    pJVar17 = local_1b0;
    pJVar16 = this->topFunc->m_alloc;
    threadContextInfo = Func::GetThreadContextInfo(this->topFunc);
    scriptContextInfo = Func::GetScriptContextInfo(this->topFunc);
    this_03 = Func::GetJITOutput(this->topFunc);
    outputData = JITOutput::GetOutputData(this_03);
    polymorphicInlineCacheInfo = runtimeInfo;
    runtimeInfo_00 = inlinee;
    codeGenAllocators = Func::GetCodeGenAllocators(this->topFunc);
    codeGenProfiler = Func::GetCodeGenProfiler(this->topFunc);
    bVar4 = Func::IsBackgroundJIT(this->topFunc);
    pFVar2 = callInstr->m_func;
    this_04 = IR::Instr::GetNextRealInstr(callInstr);
    postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(this_04);
    Func::Func(this_02,pJVar16,pJVar17,threadContextInfo,scriptContextInfo,outputData,
               (EntryPointInfo *)0x0,(FunctionJITRuntimeInfo *)runtimeInfo_00,
               (JITTimePolymorphicInlineCacheInfo *)polymorphicInlineCacheInfo,codeGenAllocators,
               codeGenProfiler,bVar4,pFVar2,postCallByteCodeOffset,workItemData._4_4_,
               (bool)(inlineBailoutChecksBeforeInstr._5_1_ & 1),returnValueOpnd._4_2_,false);
    local_200 = this_02;
    this_local = (Inline *)
                 InlineFunctionCommon
                           (this,callInstr,(bool)(inlineBailoutChecksBeforeInstr._7_1_ & 1),
                            pSStack_140,inlineeData,this_02,(Instr *)this_local,pRStack_160,
                            pIStack_150,symCallerThis,recursiveInlineDepth,
                            (bool)(inlineBailoutChecksBeforeInstr._4_1_ & 1),false);
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Inline::InlineScriptFunction(IR::Instr *callInstr, const FunctionJITTimeInfo *const inlineeData, const StackSym *symCallerThis, const Js::ProfileId profileId, bool* pIsInlined, IR::Instr * inlineeDefInstr, uint recursiveInlineDepth)
{
    *pIsInlined = false;

    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    IR::Instr *instrNext = callInstr->m_next;

    Func *funcCaller = callInstr->m_func;
    JITTimeFunctionBody *funcBody = inlineeData->GetBody();

    // We don't do stack args optimization in jitted loop body (because of lack of information about the code before and after the loop)
    // and we turn off stack arg optimization for the whole inline chain if we can't do it for one of the functionss.
    // Inlining a function that uses arguments object could potentially hurt perf because we'll have to create arguments object on the
    // heap for that function (versus otherwise the function will be jitted and have its arguments object creation optimized).
    // TODO: Allow arguments object creation to be optimized on a function level instead of an all-or-nothing approach.
    if (callInstr->m_func->IsLoopBody() && funcBody->UsesArgumentsObject())
    {
        return instrNext;
    }

    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
            funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, funcCaller->GetJITFunctionBody()->GetDisplayName(), funcCaller->GetDebugNumberSet(debugStringBuffer2));
        return instrNext;
    }

    *pIsInlined = true;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    // We are committed to inlining, optimize the call instruction for fixed fields now and don't attempt it later.
    bool isFixed = false;

    JS_ETW(EventWriteJSCRIPT_BACKEND_INLINE(
        funcCaller->GetFunctionNumber(), funcBody->GetFunctionNumber(),
        funcCaller->GetJITFunctionBody()->GetDisplayName(), funcBody->GetDisplayName()));// REVIEW: OOP JIT, was GetExternalDisplayName, does this matter?

    bool isCtor = false;
    bool safeThis = false;
    IR::Instr *inlineBailoutChecksBeforeInstr;
    if (callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray)
    {
        isCtor = true;
        isFixed = TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeData,
            false /*isPolymorphic*/, false /*isBuiltIn*/, isCtor /*isCtor*/, true /*isInlined*/, safeThis /*&safeThis*/);
        bool split = SplitConstructorCall(callInstr, true, isFixed, &inlineBailoutChecksBeforeInstr);
        Assert(split && inlineBailoutChecksBeforeInstr != nullptr);
    }
    else
    {
        isFixed = TryOptimizeCallInstrWithFixedMethod(callInstr, inlineeData,
            false /*isPolymorphic*/, false /*isBuiltIn*/, isCtor /*isCtor*/, true /*isInlined*/, safeThis /*&safeThis*/);
        inlineBailoutChecksBeforeInstr = callInstr;
    }

    Assert(callInstr->IsProfiledInstr());
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);

    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);


    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(funcBody->GetAddr());
    const FunctionJITRuntimeInfo * runtimeInfo = (inlineeDefInstr == nullptr)
        ? funcCaller->GetWorkItem()->GetJITTimeInfo()->GetInlineeForTargetInlineeRuntimeData(profileId, funcBody->GetAddr())
        : inlineeDefInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetInlineeForCallbackInlineeRuntimeData(static_cast<Js::ProfileId>(inlineeDefInstr->AsProfiledInstr()->u.profileId), funcBody->GetAddr());

#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetNumberAllocator(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->GetNextRealInstr()->GetByteCodeOffset(),
        returnRegSlot,
        isCtor,
        callSiteId,
        false);
#else
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        runtimeInfo,
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        callInstr->m_func,
        callInstr->GetNextRealInstr()->GetByteCodeOffset(),
        returnRegSlot,
        isCtor,
        callSiteId,
        false);
#endif

    return InlineFunctionCommon(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlinee, instrNext, returnValueOpnd, inlineBailoutChecksBeforeInstr, symCallerThis, recursiveInlineDepth, safeThis);
}